

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::copyBcdFrom(DecimalQuantity *this,DecimalQuantity *other)

{
  setBcdToZero(this);
  if (other->usingBytes == true) {
    ensureCapacity(this,other->precision);
    memcpy((this->fBCD).bcdBytes.ptr,(other->fBCD).bcdBytes.ptr,(long)other->precision);
    return;
  }
  (this->fBCD).bcdBytes.ptr = (other->fBCD).bcdBytes.ptr;
  return;
}

Assistant:

void DecimalQuantity::copyBcdFrom(const DecimalQuantity &other) {
    setBcdToZero();
    if (other.usingBytes) {
        ensureCapacity(other.precision);
        uprv_memcpy(fBCD.bcdBytes.ptr, other.fBCD.bcdBytes.ptr, other.precision * sizeof(int8_t));
    } else {
        fBCD.bcdLong = other.fBCD.bcdLong;
    }
}